

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::binary<double,_tcu::Vector<double,_3>,_tcu::Vector<double,_3>_>::call
          (binary<double,_tcu::Vector<double,_3>,_tcu::Vector<double,_3>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  undefined4 *puVar1;
  code *pcVar2;
  undefined8 uVar3;
  GLuint GVar4;
  Vector<double,_3> arg_2;
  Vector<double,_3> arg_1;
  Vector<double,_3> local_68;
  Vector<double,_3> local_48;
  
  GVar4 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar2 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  tcu::Vector<double,_3>::Vector(&local_48);
  tcu::Vector<double,_3>::Vector(&local_68);
  local_48.m_data[2] = *(double *)((long)argument_src + 0x10);
  local_48.m_data[0] = *argument_src;
  local_48.m_data[1] = *(double *)((long)argument_src + 8);
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar4);
  local_68.m_data[0]._0_4_ = *puVar1;
  local_68.m_data[0]._4_4_ = puVar1[1];
  local_68.m_data[1]._0_4_ = puVar1[2];
  local_68.m_data[1]._4_4_ = puVar1[3];
  local_68.m_data[2] = *(double *)((long)argument_src + (ulong)GVar4 + 0x10);
  uVar3 = (*pcVar2)(&local_48,&local_68);
  *(undefined8 *)result_dst = uVar3;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}